

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardMachine.hpp
# Opt level: O2

bool __thiscall
MachineTypes::KeyboardMachine::apply_key
          (KeyboardMachine *this,Key key,char symbol,bool is_pressed,bool is_repeat,
          bool map_logically)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined3 in_register_00000089;
  bool bVar5;
  char string [2];
  allocator<char> local_5b;
  char local_5a [2];
  KeyboardMachine *local_58;
  string local_50 [32];
  long *plVar4;
  
  local_58 = this;
  iVar3 = (*(this->super_KeyActions)._vptr_KeyActions[5])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  local_5a[0] = symbol;
  if (CONCAT31(in_register_00000089,map_logically) != 0) {
    if ((is_pressed && symbol != '\0') &&
       (iVar3 = (*(local_58->super_KeyActions)._vptr_KeyActions[4])
                          (local_58,(ulong)(uint)(int)symbol), (char)iVar3 != '\0')) {
      local_5a[1] = 0;
      std::__cxx11::string::string<std::allocator<char>>(local_50,local_5a,&local_5b);
      (*(local_58->super_KeyActions)._vptr_KeyActions[3])(local_58,local_50);
      std::__cxx11::string::~string(local_50);
      return true;
    }
    uVar2 = (**(code **)(*plVar4 + 0x10))(plVar4,key,(int)symbol,is_pressed,is_repeat);
    return (bool)uVar2;
  }
  cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,key,(int)symbol,is_pressed,is_repeat);
  bVar5 = true;
  if (cVar1 == '\0') {
    if ((is_pressed && symbol != '\0') &&
       (iVar3 = (*(local_58->super_KeyActions)._vptr_KeyActions[4])
                          (local_58,(ulong)(uint)(int)symbol), (char)iVar3 != '\0')) {
      local_5a[1] = 0;
      std::__cxx11::string::string<std::allocator<char>>(local_50,local_5a,&local_5b);
      (*(local_58->super_KeyActions)._vptr_KeyActions[3])(local_58,local_50);
      std::__cxx11::string::~string(local_50);
      return true;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool apply_key(Inputs::Keyboard::Key key, char symbol, bool is_pressed, bool is_repeat, bool map_logically) {
			Inputs::Keyboard &keyboard = get_keyboard();

			if(!map_logically) {
				// Try a regular keypress first, and stop if that works.
				if(keyboard.set_key_pressed(key, symbol, is_pressed, is_repeat)) {
					return true;
				}

				// That having failed, if a symbol has been supplied then try typing it.
				if(is_pressed && symbol && can_type(symbol)) {
					char string[2] = { symbol, 0 };
					type_string(string);
					return true;
				}

				return false;
			} else {
				// Try to type first.
				if(is_pressed && symbol && can_type(symbol)) {
					char string[2] = { symbol, 0 };
					type_string(string);
					return true;
				}

				// That didn't work. Forward as a keypress. As, either:
				//	(i) this is a key down, but doesn't have a symbol, or is an untypeable symbol; or
				//	(ii) this is a key up, which it won't be an issue to miscommunicate.
				return keyboard.set_key_pressed(key, symbol, is_pressed, is_repeat);
			}
		}